

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

PgHdr * pcacheMergeDirtyList(PgHdr *pA,PgHdr *pB)

{
  PgHdr *local_68;
  PgHdr *pTail;
  PgHdr result;
  PgHdr *pB_local;
  PgHdr *pA_local;
  
  local_68 = (PgHdr *)&pTail;
  result.pDirtyPrev = pB;
  pB_local = pA;
  while (pB_local != (PgHdr *)0x0 && result.pDirtyPrev != (PgHdr *)0x0) {
    if (pB_local->pgno < (result.pDirtyPrev)->pgno) {
      local_68->pDirty = pB_local;
      local_68 = pB_local;
      pB_local = pB_local->pDirty;
    }
    else {
      local_68->pDirty = result.pDirtyPrev;
      local_68 = result.pDirtyPrev;
      result.pDirtyPrev = (result.pDirtyPrev)->pDirty;
    }
  }
  if (pB_local == (PgHdr *)0x0) {
    if (result.pDirtyPrev == (PgHdr *)0x0) {
      local_68->pDirty = (PgHdr *)0x0;
    }
    else {
      local_68->pDirty = result.pDirtyPrev;
    }
  }
  else {
    local_68->pDirty = pB_local;
  }
  return (PgHdr *)result.pExtra;
}

Assistant:

static PgHdr *pcacheMergeDirtyList(PgHdr *pA, PgHdr *pB){
  PgHdr result, *pTail;
  pTail = &result;
  while( pA && pB ){
    if( pA->pgno<pB->pgno ){
      pTail->pDirty = pA;
      pTail = pA;
      pA = pA->pDirty;
    }else{
      pTail->pDirty = pB;
      pTail = pB;
      pB = pB->pDirty;
    }
  }
  if( pA ){
    pTail->pDirty = pA;
  }else if( pB ){
    pTail->pDirty = pB;
  }else{
    pTail->pDirty = 0;
  }
  return result.pDirty;
}